

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O0

Component ftxui::Button(ConstStringRef *label,function<void_()> *on_click,
                       Ref<ftxui::ButtonOption> option)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar1;
  undefined1 local_40 [24];
  function<void_()> *on_click_local;
  ConstStringRef *label_local;
  Ref<ftxui::ButtonOption> option_local;
  
  local_40._16_8_ = option._0_8_;
  label_local._0_1_ = option.address_._0_1_;
  on_click_local = on_click;
  option_local.address_ = (ButtonOption *)label;
  Make<ftxui::(anonymous_namespace)::ButtonBase,ftxui::ConstStringRef&,std::function<void()>,ftxui::Ref<ftxui::ButtonOption>>
            ((ConstStringRef *)local_40,on_click,(Ref<ftxui::ButtonOption> *)local_40._16_8_);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr<ftxui::(anonymous_namespace)::ButtonBase,void>
            ((shared_ptr<ftxui::ComponentBase> *)label,
             (shared_ptr<ftxui::(anonymous_namespace)::ButtonBase> *)local_40);
  std::shared_ptr<ftxui::(anonymous_namespace)::ButtonBase>::~shared_ptr
            ((shared_ptr<ftxui::(anonymous_namespace)::ButtonBase> *)local_40);
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)label;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Button(ConstStringRef label,
                 std::function<void()> on_click,
                 Ref<ButtonOption> option) {
  return Make<ButtonBase>(label, std::move(on_click), std::move(option));
}